

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O3

void cppcms::http::context::dispatch
               (shared_ptr<cppcms::application_specific_pool> *pool,
               shared_ptr<cppcms::http::context> *self,string *url)

{
  element_type *srv;
  char cVar1;
  level_type lVar2;
  ostream *poVar3;
  intrusive_ptr<cppcms::application> app;
  undefined1 local_68 [24];
  string local_50;
  
  srv = (pool->super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr;
  cppcms::impl::cgi::connection::service
            ((((self->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->conn_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  application_specific_pool::get((application_specific_pool *)local_68,(service *)srv);
  if ((application *)local_68._0_8_ == (application *)0x0) {
    lVar2 = booster::log::logger::instance();
    cVar1 = booster::log::logger::should_be_logged(lVar2,(char *)0x1e);
    if (cVar1 != '\0') {
      booster::log::message::message
                ((message *)(local_68 + 0x18),error,"cppcms",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/http_context.cpp"
                 ,0x145);
      poVar3 = (ostream *)booster::log::message::out();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Cound fetch synchronous application from a pool",0x2f);
      booster::log::message::~message((message *)(local_68 + 0x18));
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    http::response::make_error_response
              ((response *)
               (((((self->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->d).ptr_)->response)._M_t.
               super___uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
               ._M_t.
               super__Tuple_impl<0UL,_cppcms::http::response_*,_std::default_delete<cppcms::http::response>_>
               .super__Head_base<0UL,_cppcms::http::response_*,_false>,500,
               (string *)(local_68 + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    complete_response((self->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  }
  else {
    local_68._8_8_ =
         (self->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_68._16_8_ =
         (self->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_)->_M_use_count + 1;
      }
    }
    application::assign_context
              ((application *)local_68._0_8_,(shared_ptr<cppcms::http::context> *)(local_68 + 8));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_);
    }
    dispatch((intrusive_ptr<cppcms::application> *)local_68,url,true);
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)local_68);
  return;
}

Assistant:

void context::dispatch(booster::shared_ptr<application_specific_pool> const &pool,booster::shared_ptr<context> const &self,std::string const &url)
{
	booster::intrusive_ptr<application> app = pool->get(self->service());
	if(!app) {
		BOOSTER_ERROR("cppcms") << "Cound fetch synchronous application from a pool";
		self->response().make_error_response(http::response::internal_server_error);
		self->complete_response();
		return;
	}
	app->assign_context(self);
	dispatch(app,url,true);
}